

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

Gia_Man_t *
Gia_PolynCoreDetectTest_int(Gia_Man_t *pGia,Vec_Int_t *vAddCos,int fAddCones,int fVerbose)

{
  abctime aVar1;
  Vec_Int_t *vAdds;
  Vec_Int_t *vOrder;
  Vec_Int_t *vNodes;
  abctime aVar2;
  Gia_Man_t *pGVar3;
  int level;
  Vec_Int_t *vRoots;
  Vec_Int_t *vLeaves;
  
  aVar1 = Abc_Clock();
  vAdds = Ree_ManComputeCuts(pGia,(Vec_Int_t **)0x0,1);
  vOrder = Gia_PolynCoreOrder(pGia,vAdds,vAddCos,&vLeaves,&vRoots);
  vNodes = Gia_PolynCoreCollect(pGia,vAdds,vOrder);
  level = 0x83f47e;
  printf("Detected %d FAs/HAs. Roots = %d. Leaves = %d. Nodes = %d. Adds = %d. ",
         (long)vAdds->nSize / 6 & 0xffffffff,(ulong)(uint)vLeaves->nSize,(ulong)(uint)vRoots->nSize,
         (ulong)(uint)vNodes->nSize,(ulong)(uint)vOrder->nSize);
  aVar2 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
  Gia_PolynCorePrintCones(pGia,vLeaves,fVerbose);
  pGVar3 = Gia_PolynCoreDupTree(pGia,vAddCos,vLeaves,vNodes,fAddCones);
  Vec_IntFree(vAdds);
  Vec_IntFree(vLeaves);
  Vec_IntFree(vRoots);
  Vec_IntFree(vOrder);
  Vec_IntFree(vNodes);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDetectTest_int( Gia_Man_t * pGia, Vec_Int_t * vAddCos, int fAddCones, int fVerbose )
{
    extern Vec_Int_t * Ree_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvXors, int fVerbose );
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vAdds = Ree_ManComputeCuts( pGia, NULL, 1 );
    Vec_Int_t * vLeaves, * vRoots, * vOrder = Gia_PolynCoreOrder( pGia, vAdds, vAddCos, &vLeaves, &vRoots );
    Vec_Int_t * vNodes = Gia_PolynCoreCollect( pGia, vAdds, vOrder );

    //Gia_ManShow( pGia, vNodes, 0 );
    
    printf( "Detected %d FAs/HAs. Roots = %d. Leaves = %d. Nodes = %d. Adds = %d. ", 
        Vec_IntSize(vAdds)/6, Vec_IntSize(vLeaves), Vec_IntSize(vRoots), Vec_IntSize(vNodes), Vec_IntSize(vOrder) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    Gia_PolynCorePrintCones( pGia, vLeaves, fVerbose );

    pNew = Gia_PolynCoreDupTree( pGia, vAddCos, vLeaves, vNodes, fAddCones );

    Vec_IntFree( vAdds );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vRoots );
    Vec_IntFree( vOrder );
    Vec_IntFree( vNodes );
    return pNew;
}